

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Infector_single.hpp
# Opt level: O0

shared_ptr<IC> __thiscall Infector::Container::buildSingle<IC>(Container *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<IC> sVar1;
  Container *this_local;
  
  this_local = this;
  buildSingle_delegate<IC>((Container *)&stack0xffffffffffffffd8);
  std::shared_ptr<IC>::shared_ptr((shared_ptr<IC> *)this,(shared_ptr<IC> *)&stack0xffffffffffffffd8)
  ;
  std::shared_ptr<IC>::~shared_ptr((shared_ptr<IC> *)&stack0xffffffffffffffd8);
  sVar1.super___shared_ptr<IC,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<IC,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<IC>)sVar1.super___shared_ptr<IC,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> Container::buildSingle(){
        return std::move(buildSingle_delegate<T>());
    }